

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O3

void __thiscall groundupdbext::DefaultQueryResult::DefaultQueryResult(DefaultQueryResult *this)

{
  unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
  *puVar1;
  
  (this->super_IQueryResult)._vptr_IQueryResult = (_func_int **)&PTR__DefaultQueryResult_0013aaa8;
  puVar1 = (unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
            *)operator_new(0x38);
  *(undefined8 *)&(puVar1->_M_h)._M_rehash_policy = 0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_buckets = &(puVar1->_M_h)._M_single_bucket;
  (puVar1->_M_h)._M_bucket_count = 1;
  (puVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar1->_M_h)._M_element_count = 0;
  (puVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)((long)&(puVar1->_M_h)._M_rehash_policy + 8) = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_recordKeys)._M_t.
  super___uniq_ptr_impl<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
  ._M_head_impl = puVar1;
  return;
}

Assistant:

DefaultQueryResult::DefaultQueryResult()
  : m_recordKeys(std::make_unique<std::unordered_set<HashedKey>>())
{
  ;
}